

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O0

QTextStream * operator<<(QTextStream *t,QStringBuilder<QString,_const_char_(&)[4]> *str)

{
  QTextStream *pQVar1;
  QStringBuilder<QString,_const_char_(&)[4]> *in_RDI;
  long in_FS_OFFSET;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QStringBuilder::operator_cast_to_QString(in_RDI);
  pQVar1 = (QTextStream *)QTextStream::operator<<((QTextStream *)in_RDI,(QString *)local_20);
  QString::~QString((QString *)0x13a1aa);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream &operator<<(QTextStream &t, const QStringBuilder<A, B> &str) { return t << QString(str); }